

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling_layer.c
# Opt level: O0

void avg_pooling_layer_forward(layer_t *l)

{
  int iVar1;
  data_val_t *pdVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int index;
  int pool_offset;
  int offset;
  int out_size;
  int pool_size;
  int channels;
  pooling_layer_t *pooling;
  int b;
  int k;
  int j;
  int i;
  layer_t *l_local;
  
  iVar1 = *(int *)&l[1].func;
  iVar3 = *(int *)&l[1].in.m * *(int *)&l[1].in.m;
  iVar4 = *(int *)((long)&l[1].in.grad + 4) * *(int *)&l[1].in.grad;
  for (pooling._0_4_ = 0; (int)pooling < l->n->batch; pooling._0_4_ = (int)pooling + 1) {
    im2col(&(l->in).val,(int)pooling * (l->in).size,*(int *)&l[1].func,*(int *)&l[1].in.val,
           *(int *)((long)&l[1].func + 4),*(int *)&l[1].in.m,*(int *)((long)&l[1].in.m + 4),
           *(int *)&l[1].in.v,&(l->extra).val,0);
    for (pooling._4_4_ = 0; pooling._4_4_ < iVar1; pooling._4_4_ = pooling._4_4_ + 1) {
      iVar5 = pooling._4_4_ * iVar4;
      for (k = 0; k < iVar3; k = k + 1) {
        for (b = 0; b < iVar4; b = b + 1) {
          pdVar2 = (l->out).val;
          iVar6 = (int)pooling * (l->out).size + iVar5 + b;
          pdVar2[iVar6] = (l->extra).val[iVar3 * iVar5 + k * iVar4 + b] + pdVar2[iVar6];
        }
      }
      for (b = 0; b < iVar4; b = b + 1) {
        pdVar2 = (l->out).val;
        iVar6 = (int)pooling * (l->out).size + iVar5 + b;
        pdVar2[iVar6] = pdVar2[iVar6] / (float)iVar3;
      }
    }
  }
  return;
}

Assistant:

static void avg_pooling_layer_forward(layer_t *l)
{
	int i = 0, j = 0, k = 0, b = 0;
	pooling_layer_t *pooling = (pooling_layer_t *)l;

	int channels = pooling->ic;
	int pool_size = pooling->k * pooling->k;
	int out_size = pooling->oh * pooling->ow;

	for (b = 0; b < l->n->batch; ++b)
	{
		im2col(&l->in.val, b * l->in.size, pooling->ic, pooling->ih, pooling->iw, pooling->k, pooling->s, pooling->p, &l->extra.val, 0);

		for (k = 0; k < channels; ++k)
		{
			int offset = k * out_size;
			int pool_offset = pool_size * offset;

			for (i = 0; i < pool_size; ++i)
			{
				int index = pool_offset + i * out_size;
				for (j = 0; j < out_size; ++j)
				{
					l->out.val[b * l->out.size + offset + j] += l->extra.val[index + j];
				}
			}

			for (j = 0; j < out_size; ++j)
			{
				l->out.val[b * l->out.size + offset + j] /= pool_size;
			}
		}
	}
}